

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

int pdrv(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  stringstream msg;
  StatisticsApp application;
  CommandLineOptions options;
  undefined1 local_4b0 [40];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  vector<bool,_std::allocator<bool>_> vStack_428;
  vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_> vStack_400;
  vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
  avStack_3e8 [3];
  undefined8 uStack_39a;
  undefined8 local_390;
  filebuf local_388 [240];
  undefined **local_298 [34];
  pointer local_188;
  pointer local_178;
  vector<StatisticsTracker,_std::allocator<StatisticsTracker>_> local_158;
  undefined1 local_140 [40];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  vector<bool,_std::allocator<bool>_> local_b8;
  vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_> local_90;
  vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
  avStack_78 [3];
  undefined8 uStack_2a;
  
  CommandLineOptions::CommandLineOptions((CommandLineOptions *)local_140);
  CommandLineParser::CommandLineParser((CommandLineParser *)local_4b0,argc,argv);
  if (local_390._0_1_ == (ofstream)0x1) {
    CommandLineParser::printUsage();
  }
  else {
    if (local_390._1_1_ != true) {
      local_140[0] = local_4b0[0];
      std::__cxx11::string::_M_assign((string *)(local_140 + 8),(string *)(local_4b0 + 8));
      std::__cxx11::string::_M_assign(local_118,local_488);
      std::__cxx11::string::_M_assign(local_f8,local_468);
      std::__cxx11::string::_M_assign(local_d8,local_448);
      std::vector<bool,_std::allocator<bool>_>::operator=(&local_b8,&vStack_428);
      std::vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>::
      operator=(&local_90,&vStack_400);
      std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
      operator=(avStack_78,avStack_3e8);
      uStack_2a = uStack_39a;
      avStack_78[2].
      super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           avStack_3e8[2].
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      avStack_78[1].
      super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           avStack_3e8[1].
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      avStack_78[2].
      super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
      ._M_impl.super__Vector_impl_data._M_start =
           avStack_3e8[2].
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
      avStack_78[1].
      super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
      ._M_impl.super__Vector_impl_data._M_start =
           avStack_3e8[1].
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
      avStack_78[1].
      super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           avStack_3e8[1].
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      CommandLineOptions::~CommandLineOptions((CommandLineOptions *)local_4b0);
      StatisticsApp::StatisticsApp((StatisticsApp *)local_4b0,(CommandLineOptions *)local_140);
      iVar2 = StatisticsApp::run((StatisticsApp *)local_4b0);
      if (iVar2 == 0) {
        bVar1 = StatisticsApp::display((StatisticsApp *)local_4b0);
        iVar2 = (uint)!bVar1 + (uint)!bVar1 * 2;
      }
      else {
        iVar2 = (uint)(iVar2 != 0) * 2;
      }
      std::vector<StatisticsTracker,_std::allocator<StatisticsTracker>_>::~vector(&local_158);
      if (local_188 != (pointer)0x0) {
        operator_delete(local_188,(long)local_178 - (long)local_188);
      }
      local_390 = &PTR__ofstream_0028b9c0;
      local_298[0] = &PTR__ofstream_0028b9e8;
      std::filebuf::~filebuf(local_388);
      std::ios_base::~ios_base((ios_base *)local_298);
      CommandLineOptions::~CommandLineOptions((CommandLineOptions *)local_4b0);
      goto LAB_0017a685;
    }
    CommandLineParser::printVersion();
  }
  CommandLineOptions::~CommandLineOptions((CommandLineOptions *)local_4b0);
  iVar2 = 0;
LAB_0017a685:
  CommandLineOptions::~CommandLineOptions((CommandLineOptions *)local_140);
  return iVar2;
}

Assistant:

int
pdrv(int argc,
     char * argv[])
{

    // ======================================================================
    // Parse command line arguments
    // ----------------------------------------------------------------------
    CommandLineOptions options;

    try
    {
        CommandLineParser parser(argc, argv);
        if (parser.showUsage())
        {
            CommandLineParser::printUsage();
            return AppStatus::SUCCESS;
        }
        else if (parser.showVersion())
        {
            CommandLineParser::printVersion();
            return AppStatus::SUCCESS;
        }
        options = parser.options;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_PARSING;
    }

    // ======================================================================
    // Launch application
    // ----------------------------------------------------------------------
    StatisticsApp application(options);

    try
    {
        int status = application.run();
        if (status != 0) return AppStatus::FAILED_RUN;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_RUN;
    }

    // ======================================================================
    // Display results
    // ----------------------------------------------------------------------
    
    try
    {
        bool isDisplayValid = application.display();
        if (!isDisplayValid) return AppStatus::FAILED_DISPLAY;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_DISPLAY;
    }
        
    return AppStatus::SUCCESS;

}